

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtManifoldResult.cpp
# Opt level: O1

cbtScalar cbtManifoldResult::calculateCombinedContactStiffness
                    (cbtCollisionObject *body0,cbtCollisionObject *body1)

{
  return 1.0 / (1.0 / body0->m_contactStiffness + 1.0 / body1->m_contactStiffness);
}

Assistant:

cbtScalar cbtManifoldResult::calculateCombinedContactStiffness(const cbtCollisionObject* body0, const cbtCollisionObject* body1)
{
	cbtScalar s0 = body0->getContactStiffness();
	cbtScalar s1 = body1->getContactStiffness();

	cbtScalar tmp0 = cbtScalar(1) / s0;
	cbtScalar tmp1 = cbtScalar(1) / s1;
	cbtScalar combinedStiffness = cbtScalar(1) / (tmp0 + tmp1);
	return combinedStiffness;
}